

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InstructionFolder::BinaryOperate
          (InstructionFolder *this,Op opcode,uint32_t a,uint32_t b)

{
  uint32_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  bool bVar4;
  
  bVar2 = (byte)b;
  switch(opcode) {
  case OpLogicalEqual:
    bVar4 = b == 0;
    goto LAB_002062cf;
  case OpLogicalNotEqual:
    bVar4 = b != 0;
LAB_002062cf:
    bVar4 = (bool)(bVar4 ^ a != 0);
LAB_002062f5:
    return (uint32_t)bVar4;
  case OpLogicalOr:
    bVar4 = b == 0 && a == 0;
    goto LAB_002062dd;
  case OpLogicalAnd:
    bVar4 = b != 0 && a != 0;
    goto LAB_002062f5;
  default:
    __assert_fail("false && \"Unsupported binary operation for OpSpecConstantOp instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x93,
                  "uint32_t spvtools::opt::InstructionFolder::BinaryOperate(spv::Op, uint32_t, uint32_t) const"
                 );
  case OpIEqual:
    return (uint32_t)(a == b);
  case OpINotEqual:
    bVar4 = a == b;
LAB_002062dd:
    return (uint32_t)!bVar4;
  case OpUGreaterThan:
    return (uint32_t)(b < a);
  case OpSGreaterThan:
    return (uint32_t)((int)b < (int)a);
  case OpUGreaterThanEqual:
    return (uint32_t)(b <= a);
  case OpSGreaterThanEqual:
    return (uint32_t)((int)b <= (int)a);
  case OpULessThan:
    return (uint32_t)(a < b);
  case OpSLessThan:
    return (uint32_t)((int)a < (int)b);
  case OpULessThanEqual:
    return (uint32_t)(a <= b);
  case OpSLessThanEqual:
    return (uint32_t)((int)a <= (int)b);
  case OpShiftRightLogical:
    uVar3 = a >> (bVar2 & 0x1f);
    goto LAB_002062a6;
  case OpShiftRightArithmetic:
    uVar3 = 0;
    if (b < 0x21) {
      if (b == 0x20) {
        uVar3 = (int)a >> 0x1f;
      }
      else {
        uVar3 = (int)a >> (bVar2 & 0x1f);
      }
    }
    return uVar3;
  case OpShiftLeftLogical:
    uVar3 = a << (bVar2 & 0x1f);
LAB_002062a6:
    uVar1 = 0;
    if (b < 0x20) {
      uVar1 = uVar3;
    }
    return uVar1;
  case OpBitwiseOr:
    uVar3 = b | a;
    break;
  case OpBitwiseXor:
    uVar3 = b ^ a;
    break;
  case OpBitwiseAnd:
    uVar3 = b & a;
  }
  return uVar3;
}

Assistant:

uint32_t InstructionFolder::BinaryOperate(spv::Op opcode, uint32_t a,
                                          uint32_t b) const {
  switch (opcode) {
    // Shifting
    case spv::Op::OpShiftRightLogical:
      if (b >= 32) {
        // This is undefined behaviour when |b| > 32.  Choose 0 for consistency.
        // When |b| == 32, doing the shift in C++ in undefined, but the result
        // will be 0, so just return that value.
        return 0;
      }
      return a >> b;
    case spv::Op::OpShiftRightArithmetic:
      if (b > 32) {
        // This is undefined behaviour.  Choose 0 for consistency.
        return 0;
      }
      if (b == 32) {
        // Doing the shift in C++ is undefined, but the result is defined in the
        // spir-v spec.  Find that value another way.
        if (static_cast<int32_t>(a) >= 0) {
          return 0;
        } else {
          return static_cast<uint32_t>(-1);
        }
      }
      return (static_cast<int32_t>(a)) >> b;
    case spv::Op::OpShiftLeftLogical:
      if (b >= 32) {
        // This is undefined behaviour when |b| > 32.  Choose 0 for consistency.
        // When |b| == 32, doing the shift in C++ in undefined, but the result
        // will be 0, so just return that value.
        return 0;
      }
      return a << b;

    // Bitwise operations
    case spv::Op::OpBitwiseOr:
      return a | b;
    case spv::Op::OpBitwiseAnd:
      return a & b;
    case spv::Op::OpBitwiseXor:
      return a ^ b;

    // Logical
    case spv::Op::OpLogicalEqual:
      return (static_cast<bool>(a)) == (static_cast<bool>(b));
    case spv::Op::OpLogicalNotEqual:
      return (static_cast<bool>(a)) != (static_cast<bool>(b));
    case spv::Op::OpLogicalOr:
      return (static_cast<bool>(a)) || (static_cast<bool>(b));
    case spv::Op::OpLogicalAnd:
      return (static_cast<bool>(a)) && (static_cast<bool>(b));

    // Comparison
    case spv::Op::OpIEqual:
      return a == b;
    case spv::Op::OpINotEqual:
      return a != b;
    case spv::Op::OpULessThan:
      return a < b;
    case spv::Op::OpSLessThan:
      return (static_cast<int32_t>(a)) < (static_cast<int32_t>(b));
    case spv::Op::OpUGreaterThan:
      return a > b;
    case spv::Op::OpSGreaterThan:
      return (static_cast<int32_t>(a)) > (static_cast<int32_t>(b));
    case spv::Op::OpULessThanEqual:
      return a <= b;
    case spv::Op::OpSLessThanEqual:
      return (static_cast<int32_t>(a)) <= (static_cast<int32_t>(b));
    case spv::Op::OpUGreaterThanEqual:
      return a >= b;
    case spv::Op::OpSGreaterThanEqual:
      return (static_cast<int32_t>(a)) >= (static_cast<int32_t>(b));
    default:
      assert(false &&
             "Unsupported binary operation for OpSpecConstantOp instruction");
      return 0u;
  }
}